

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O2

double __thiscall Calculator::value(Calculator *this,Token *t)

{
  double def;
  double local_8;
  
  local_8 = 0.0;
  if (t->type == NAME) {
    t = (Token *)asl::Map<asl::String,_double>::get
                           (&(this->_variables).super_Map<asl::String,_double>,&t->val,&local_8);
  }
  return t->x;
}

Assistant:

double Calculator::value(const Calculator::Token& t) const
{
	double def = 0.0;
	return (t.type == NAME)? _variables.get(t.val, def) : t.x;
}